

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageScaleBicubicFixed(gdImagePtr src,uint width,uint height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte local_290;
  byte local_288;
  byte local_280;
  byte local_278;
  byte local_270;
  byte local_268;
  byte local_260;
  byte local_258;
  uint local_250;
  uint local_24c;
  int _k;
  int c;
  gdFixed f_ba;
  gdFixed f_bs;
  gdFixed f_gs;
  gdFixed f_rs;
  gdFixed f_R;
  gdFixed f_RX;
  gdFixed f_d_1;
  gdFixed f_c_1;
  gdFixed f_b_2;
  gdFixed f_a_2;
  gdFixed f_fp2_1;
  gdFixed f_fp1_1;
  gdFixed f_fm1_1;
  gdFixed f_3;
  int l;
  gdFixed f_RY;
  gdFixed f_c;
  gdFixed f_d;
  gdFixed f_b_1;
  gdFixed f_a_1;
  gdFixed f_fp2;
  gdFixed f_fp1;
  gdFixed f_fm1;
  gdFixed f;
  int *dst_row;
  uchar alpha;
  uchar blue;
  uchar green;
  long lStack_170;
  uchar red;
  gdFixed f_alpha;
  gdFixed f_blue;
  gdFixed f_green;
  gdFixed f_red;
  long k;
  uint src_offset_y [16];
  uint src_offset_x [16];
  gdFixed f_g;
  gdFixed f_f;
  long n;
  long m;
  gdFixed f_b;
  gdFixed f_a;
  long j;
  long i;
  uint dst_offset_y;
  uint dst_offset_x;
  gdImagePtr dst;
  gdFixed f_gamma;
  gdFixed f_6;
  gdFixed f_4;
  gdFixed f_2;
  gdFixed f_1;
  gdFixed f_dy;
  gdFixed f_dx;
  int src_h;
  int src_w;
  long new_height;
  long new_width;
  uint height_local;
  uint width_local;
  gdImagePtr src_local;
  
  local_24c = width;
  if (width < 2) {
    local_24c = 1;
  }
  local_250 = height;
  if (height < 2) {
    local_250 = 1;
  }
  iVar1 = src->sx;
  iVar2 = src->sy;
  i._0_4_ = 0;
  if (src->trueColor == 0) {
    gdImagePaletteToTrueColor(src);
  }
  src_local = gdImageCreateTrueColor(local_24c,local_250);
  if (src_local == (gdImagePtr)0x0) {
    src_local = (gdImagePtr)0x0;
  }
  else {
    src_local->saveAlphaFlag = 1;
    for (j = 0; j < (long)(ulong)local_250; j = j + 1) {
      i._4_4_ = 0;
      for (f_a = 0; f_a < (long)(ulong)local_24c; f_a = f_a + 1) {
        lVar5 = j * 0x100 * (long)(((float)iVar2 / (float)local_250) * 256.0);
        lVar6 = f_a * 0x100 * (long)(((float)iVar1 / (float)local_24c) * 256.0);
        lVar7 = lVar5 >> 0x10;
        lVar8 = lVar6 >> 0x10;
        f_green = 0;
        f_blue = 0;
        f_alpha = 0;
        lStack_170 = 0;
        src_offset_y[0xf] = (uint)((ulong)lVar6 >> 0x10);
        src_offset_y[0] = (uint)((ulong)lVar5 >> 0x10);
        if ((lVar7 < 1) || (lVar8 < 1)) {
          src_offset_y[0xe] = src_offset_y[0xf];
        }
        else {
          src_offset_y[0xe] = src_offset_y[0xf] - 1;
        }
        if ((lVar7 < 1) || (iVar1 + -1 <= lVar8)) {
        }
        else {
        }
        if ((lVar7 < 1) || (iVar1 + -2 <= lVar8)) {
          src_offset_y[1] = src_offset_y[0];
        }
        else {
          src_offset_y[1] = src_offset_y[0];
        }
        if (lVar8 < 1) {
          src_offset_y[2] = src_offset_y[0];
        }
        else {
          src_offset_y[2] = src_offset_y[0];
        }
        src_offset_y[3] = src_offset_y[0];
        if (lVar8 < iVar1 + -1) {
          src_offset_y[4] = src_offset_y[0];
        }
        else {
          src_offset_y[4] = src_offset_y[0];
        }
        if (lVar8 < iVar1 + -2) {
          src_offset_y[5] = src_offset_y[0];
        }
        else {
          src_offset_y[5] = src_offset_y[0];
        }
        if ((lVar7 < iVar2 + -1) && (0 < lVar8)) {
          src_offset_y[6] = src_offset_y[0];
        }
        else {
          src_offset_y[6] = src_offset_y[0];
        }
        src_offset_y[7] = src_offset_y[0];
        if ((lVar7 < iVar2 + -1) && (lVar8 < iVar1 + -1)) {
          src_offset_y[8] = src_offset_y[0];
        }
        else {
          src_offset_y[8] = src_offset_y[0];
        }
        if ((lVar7 < iVar2 + -1) && (lVar8 < iVar1 + -2)) {
          src_offset_y[9] = src_offset_y[0];
        }
        else {
          src_offset_y[9] = src_offset_y[0];
        }
        if ((lVar7 < iVar2 + -2) && (0 < lVar8)) {
          src_offset_y[10] = src_offset_y[0];
        }
        else {
          src_offset_y[10] = src_offset_y[0];
        }
        if (lVar7 < iVar2 + -2) {
          src_offset_y[0xb] = src_offset_y[0];
        }
        if ((lVar7 < iVar2 + -2) && (lVar8 < iVar1 + -1)) {
          src_offset_y[0xc] = src_offset_y[0];
        }
        else {
          src_offset_y[0xc] = src_offset_y[0];
        }
        if ((lVar7 < iVar2 + -2) && (lVar8 < iVar1 + -2)) {
          src_offset_y[0xd] = src_offset_y[0];
        }
        else {
          src_offset_y[0xd] = src_offset_y[0];
        }
        for (f_red = -1; f_red < 3; f_red = f_red + 1) {
          lVar9 = f_red * 0x100 - ((lVar5 >> 8) + lVar7 * -0x100);
          lVar10 = lVar9 + -0x100;
          lVar11 = lVar9 + 0x100;
          lVar12 = lVar9 + 0x200;
          f_b_1 = 0;
          f_d = 0;
          f_c = 0;
          f_RY = 0;
          if (0 < lVar12) {
            f_b_1 = lVar12 * (lVar12 * lVar12 >> 8) >> 8;
          }
          if (0 < lVar11) {
            f_d = lVar11 * (lVar11 * lVar11 >> 8) >> 8;
          }
          if (0 < lVar9) {
            f_RY = lVar9 * (lVar9 * lVar9 >> 8) >> 8;
          }
          if (0 < lVar10) {
            f_c = lVar10 * (lVar10 * lVar10 >> 8) >> 8;
          }
          for (f_3._4_4_ = -1; f_3._4_4_ < 3; f_3._4_4_ = f_3._4_4_ + 1) {
            lVar9 = (long)(f_3._4_4_ << 8) - ((lVar6 >> 8) + lVar8 * -0x100);
            lVar10 = lVar9 + -0x100;
            lVar11 = lVar9 + 0x100;
            lVar12 = lVar9 + 0x200;
            f_b_2 = 0;
            f_c_1 = 0;
            f_d_1 = 0;
            f_RX = 0;
            iVar4 = ((int)f_red + 1) * 4 + f_3._4_4_ + 1;
            if (0 < lVar12) {
              f_b_2 = lVar12 * (lVar12 * lVar12 >> 8) >> 8;
            }
            if (0 < lVar11) {
              f_c_1 = lVar11 * (lVar11 * lVar11 >> 8) >> 8;
            }
            if (0 < lVar9) {
              f_d_1 = lVar9 * (lVar9 * lVar9 >> 8) >> 8;
            }
            if (0 < lVar10) {
              f_RX = lVar10 * (lVar10 * lVar10 >> 8) >> 8;
            }
            lVar9 = (((((f_b_1 - ((f_d << 10) >> 8)) + (f_RY * 0x600 >> 8)) - ((f_c << 10) >> 8)) *
                     0x100) / 0x600) *
                    (((((f_b_2 - ((f_c_1 << 10) >> 8)) + (f_d_1 * 0x600 >> 8)) - ((f_RX << 10) >> 8)
                      ) * 0x100) / 0x600) >> 8;
            uVar3 = src->tpixels[src_offset_y[(long)iVar4 + -2]][src_offset_y[(long)iVar4 + 0xe]];
            f_green = ((((int)(uVar3 & 0xff0000) >> 0x10) << 8) * lVar9 >> 8) + f_green;
            f_blue = ((((int)(uVar3 & 0xff00) >> 8) << 8) * lVar9 >> 8) + f_blue;
            f_alpha = ((int)((uVar3 & 0xff) << 8) * lVar9 >> 8) + f_alpha;
            lStack_170 = ((((int)(uVar3 & 0x7f000000) >> 0x18) << 8) * lVar9 >> 8) + lStack_170;
          }
        }
        if (f_green * 0x10a >> 0x10 < 0x100) {
          if (f_green * 0x10a >> 0x10 < 0) {
            local_260 = 0;
          }
          else {
            local_260 = (byte)((ulong)(f_green * 0x10a) >> 0x10);
          }
          local_258 = local_260;
        }
        else {
          local_258 = 0xff;
        }
        if (f_blue * 0x10a >> 0x10 < 0x100) {
          if (f_blue * 0x10a >> 0x10 < 0) {
            local_270 = 0;
          }
          else {
            local_270 = (byte)((ulong)(f_blue * 0x10a) >> 0x10);
          }
          local_268 = local_270;
        }
        else {
          local_268 = 0xff;
        }
        if (f_alpha * 0x10a >> 0x10 < 0x100) {
          if (f_alpha * 0x10a >> 0x10 < 0) {
            local_280 = 0;
          }
          else {
            local_280 = (byte)((ulong)(f_alpha * 0x10a) >> 0x10);
          }
          local_278 = local_280;
        }
        else {
          local_278 = 0xff;
        }
        if (lStack_170 * 0x10a >> 0x10 < 0x80) {
          if (lStack_170 * 0x10a >> 0x10 < 0) {
            local_290 = 0;
          }
          else {
            local_290 = (byte)((ulong)(lStack_170 * 0x10a) >> 0x10);
          }
          local_288 = local_290;
        }
        else {
          local_288 = 0x7f;
        }
        src_local->tpixels[(uint)i][i._4_4_] =
             (uint)local_288 * 0x1000000 + (uint)local_258 * 0x10000 + (uint)local_268 * 0x100 +
             (uint)local_278;
        i._4_4_ = i._4_4_ + 1;
      }
      i._0_4_ = (uint)i + 1;
    }
  }
  return src_local;
}

Assistant:

static gdImagePtr
gdImageScaleBicubicFixed(gdImagePtr src, const unsigned int width,
                         const unsigned int height)
{
	const long new_width = MAX(1, width);
	const long new_height = MAX(1, height);
	const int src_w = gdImageSX(src);
	const int src_h = gdImageSY(src);
	const gdFixed f_dx = gd_ftofx((float)src_w / (float)new_width);
	const gdFixed f_dy = gd_ftofx((float)src_h / (float)new_height);
	const gdFixed f_1 = gd_itofx(1);
	const gdFixed f_2 = gd_itofx(2);
	const gdFixed f_4 = gd_itofx(4);
	const gdFixed f_6 = gd_itofx(6);
	const gdFixed f_gamma = gd_ftofx(1.04f);
	gdImagePtr dst;

	unsigned int dst_offset_x;
	unsigned int dst_offset_y = 0;
	long i;

	/* impact perf a bit, but not that much. Implementation for palette
	   images can be done at a later point.
	*/
	if (src->trueColor == 0) {
		gdImagePaletteToTrueColor(src);
	}

	dst = gdImageCreateTrueColor(new_width, new_height);
	if (!dst) {
		return NULL;
	}

	dst->saveAlphaFlag = 1;

	for (i=0; i < new_height; i++) {
		long j;
		dst_offset_x = 0;

		for (j=0; j < new_width; j++) {
			const gdFixed f_a = gd_mulfx(gd_itofx(i), f_dy);
			const gdFixed f_b = gd_mulfx(gd_itofx(j), f_dx);
			const long m = gd_fxtoi(f_a);
			const long n = gd_fxtoi(f_b);
			const gdFixed f_f = f_a - gd_itofx(m);
			const gdFixed f_g = f_b - gd_itofx(n);
			unsigned int src_offset_x[16], src_offset_y[16];
			long k;
			register gdFixed f_red = 0, f_green = 0, f_blue = 0, f_alpha = 0;
			unsigned char red, green, blue, alpha = 0;
			int *dst_row = dst->tpixels[dst_offset_y];

			if ((m < 1) || (n < 1)) {
				src_offset_x[0] = n;
				src_offset_y[0] = m;
			} else {
				src_offset_x[0] = n - 1;
				src_offset_y[0] = m;
			}

			src_offset_x[1] = n;
			src_offset_y[1] = m;

			if ((m < 1) || (n >= src_w - 1)) {
				src_offset_x[2] = n;
				src_offset_y[2] = m;
			} else {
				src_offset_x[2] = n + 1;
				src_offset_y[2] = m;
			}

			if ((m < 1) || (n >= src_w - 2)) {
				src_offset_x[3] = n;
				src_offset_y[3] = m;
			} else {
				src_offset_x[3] = n + 1 + 1;
				src_offset_y[3] = m;
			}

			if (n < 1) {
				src_offset_x[4] = n;
				src_offset_y[4] = m;
			} else {
				src_offset_x[4] = n - 1;
				src_offset_y[4] = m;
			}

			src_offset_x[5] = n;
			src_offset_y[5] = m;
			if (n >= src_w-1) {
				src_offset_x[6] = n;
				src_offset_y[6] = m;
			} else {
				src_offset_x[6] = n + 1;
				src_offset_y[6] = m;
			}

			if (n >= src_w - 2) {
				src_offset_x[7] = n;
				src_offset_y[7] = m;
			} else {
				src_offset_x[7] = n + 1 + 1;
				src_offset_y[7] = m;
			}

			if ((m >= src_h - 1) || (n < 1)) {
				src_offset_x[8] = n;
				src_offset_y[8] = m;
			} else {
				src_offset_x[8] = n - 1;
				src_offset_y[8] = m;
			}

			src_offset_x[9] = n;
			src_offset_y[9] = m;

			if ((m >= src_h-1) || (n >= src_w-1)) {
				src_offset_x[10] = n;
				src_offset_y[10] = m;
			} else {
				src_offset_x[10] = n + 1;
				src_offset_y[10] = m;
			}

			if ((m >= src_h - 1) || (n >= src_w - 2)) {
				src_offset_x[11] = n;
				src_offset_y[11] = m;
			} else {
				src_offset_x[11] = n + 1 + 1;
				src_offset_y[11] = m;
			}

			if ((m >= src_h - 2) || (n < 1)) {
				src_offset_x[12] = n;
				src_offset_y[12] = m;
			} else {
				src_offset_x[12] = n - 1;
				src_offset_y[12] = m;
			}

			if (!(m >= src_h - 2)) {
				src_offset_x[13] = n;
				src_offset_y[13] = m;
			}

			if ((m >= src_h - 2) || (n >= src_w - 1)) {
				src_offset_x[14] = n;
				src_offset_y[14] = m;
			} else {
				src_offset_x[14] = n + 1;
				src_offset_y[14] = m;
			}

			if ((m >= src_h - 2) || (n >= src_w - 2)) {
				src_offset_x[15] = n;
				src_offset_y[15] = m;
			} else {
				src_offset_x[15] = n  + 1 + 1;
				src_offset_y[15] = m;
			}

			for (k = -1; k < 3; k++) {
				const gdFixed f = gd_itofx(k)-f_f;
				const gdFixed f_fm1 = f - f_1;
				const gdFixed f_fp1 = f + f_1;
				const gdFixed f_fp2 = f + f_2;
				register gdFixed f_a = 0, f_b = 0, f_d = 0, f_c = 0;
				register gdFixed f_RY;
				int l;

				if (f_fp2 > 0) f_a = gd_mulfx(f_fp2, gd_mulfx(f_fp2,f_fp2));
				if (f_fp1 > 0) f_b = gd_mulfx(f_fp1, gd_mulfx(f_fp1,f_fp1));
				if (f > 0)     f_c = gd_mulfx(f, gd_mulfx(f,f));
				if (f_fm1 > 0) f_d = gd_mulfx(f_fm1, gd_mulfx(f_fm1,f_fm1));

				f_RY = gd_divfx((f_a - gd_mulfx(f_4,f_b) + gd_mulfx(f_6,f_c) - gd_mulfx(f_4,f_d)),f_6);

				for (l = -1; l < 3; l++) {
					const gdFixed f = gd_itofx(l) - f_g;
					const gdFixed f_fm1 = f - f_1;
					const gdFixed f_fp1 = f + f_1;
					const gdFixed f_fp2 = f + f_2;
					register gdFixed f_a = 0, f_b = 0, f_c = 0, f_d = 0;
					register gdFixed f_RX, f_R, f_rs, f_gs, f_bs, f_ba;
					register int c;
					const int _k = ((k+1)*4) + (l+1);

					if (f_fp2 > 0) f_a = gd_mulfx(f_fp2,gd_mulfx(f_fp2,f_fp2));

					if (f_fp1 > 0) f_b = gd_mulfx(f_fp1,gd_mulfx(f_fp1,f_fp1));

					if (f > 0) f_c = gd_mulfx(f,gd_mulfx(f,f));

					if (f_fm1 > 0) f_d = gd_mulfx(f_fm1,gd_mulfx(f_fm1,f_fm1));

					f_RX = gd_divfx((f_a-gd_mulfx(f_4,f_b)+gd_mulfx(f_6,f_c)-gd_mulfx(f_4,f_d)),f_6);
					f_R = gd_mulfx(f_RY,f_RX);

					c = src->tpixels[*(src_offset_y + _k)][*(src_offset_x + _k)];
					f_rs = gd_itofx(gdTrueColorGetRed(c));
					f_gs = gd_itofx(gdTrueColorGetGreen(c));
					f_bs = gd_itofx(gdTrueColorGetBlue(c));
					f_ba = gd_itofx(gdTrueColorGetAlpha(c));

					f_red += gd_mulfx(f_rs,f_R);
					f_green += gd_mulfx(f_gs,f_R);
					f_blue += gd_mulfx(f_bs,f_R);
					f_alpha += gd_mulfx(f_ba,f_R);
				}
			}

			red    = (unsigned char) CLAMP(gd_fxtoi(gd_mulfx(f_red,   f_gamma)),  0, 255);
			green  = (unsigned char) CLAMP(gd_fxtoi(gd_mulfx(f_green, f_gamma)),  0, 255);
			blue   = (unsigned char) CLAMP(gd_fxtoi(gd_mulfx(f_blue,  f_gamma)),  0, 255);
			alpha  = (unsigned char) CLAMP(gd_fxtoi(gd_mulfx(f_alpha,  f_gamma)), 0, 127);

			*(dst_row + dst_offset_x) = gdTrueColorAlpha(red, green, blue, alpha);

			dst_offset_x++;
		}
		dst_offset_y++;
	}
	return dst;
}